

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O1

int vrna_E_ext_loop_3(vrna_fold_compound_t *fc,int i)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  vrna_hc_t *pvVar5;
  vrna_sc_t *pvVar6;
  vrna_sc_t **ppvVar7;
  vrna_ud_t *pvVar8;
  vrna_param_t *pvVar9;
  short *psVar10;
  char **ppcVar11;
  uint *puVar12;
  char *pcVar13;
  short **ppsVar14;
  uint **ppuVar15;
  bool bVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  uchar uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  code *evaluate;
  ulong uVar28;
  int *piVar29;
  long lVar30;
  void *pvVar31;
  void *pvVar32;
  void *pvVar33;
  ulong uVar34;
  undefined2 uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  uint uVar40;
  uint uVar41;
  int (*paiVar42) [5];
  long lVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  int iVar48;
  undefined4 in_register_00000034;
  int (*paaiVar49) [5] [5];
  int iVar50;
  ulong uVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  bool bVar55;
  sc_wrapper_f3 sc_wrapper;
  default_data hc_dat_local;
  uint local_1d0;
  int local_114;
  sc_wrapper_f3 local_f0;
  int (*local_88) [5];
  int local_7c;
  default_data local_78;
  short *local_40;
  int (*local_38) [5];
  
  if (fc == (vrna_fold_compound_t *)0x0) {
    return 10000000;
  }
  pvVar5 = fc->hc;
  iVar22 = (fc->params->model_details).dangles;
  local_7c = (fc->params->model_details).gquad;
  local_78.mx_window = (uchar **)(pvVar5->field_3).field_0.matrix;
  local_78.hc_up = pvVar5->up_ext;
  local_78.sn = fc->strand_number;
  if (pvVar5->f == (vrna_callback_hc_evaluate *)0x0) {
    evaluate = hc_default_window;
  }
  else {
    local_78.hc_dat = pvVar5->data;
    evaluate = hc_default_user_window;
    local_78.hc_f = pvVar5->f;
  }
  local_f0.n = fc->length;
  local_f0.n_seq = 1;
  local_f0.up = (int **)0x0;
  local_f0.red_ext = (code *)0x0;
  local_f0.red_stem = (code *)0x0;
  local_f0.decomp_stem = (code *)0x0;
  local_f0.decomp_stem1 = (code *)0x0;
  local_f0.user_cb = (vrna_callback_sc_energy *)0x0;
  local_f0.user_data = (void *)0x0;
  local_f0.up_comparative = (int ***)0x0;
  local_f0.user_cb_comparative = (vrna_callback_sc_energy **)0x0;
  local_f0.user_data_comparative = (void **)0x0;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    ppvVar7 = (fc->field_23).field_1.scs;
    local_f0.n_seq = (fc->field_23).field_1.n_seq;
    local_f0.a2s = (fc->field_23).field_1.a2s;
    if (ppvVar7 != (vrna_sc_t **)0x0) {
      local_f0.up_comparative = (int ***)vrna_alloc(local_f0.n_seq << 3);
      local_f0.user_cb_comparative =
           (vrna_callback_sc_energy **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
      local_f0.user_data_comparative = (void **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
      if ((fc->field_23).field_1.n_seq == 0) {
        bVar55 = true;
        bVar16 = true;
      }
      else {
        uVar28 = 0;
        bVar16 = false;
        bVar55 = false;
        do {
          if (ppvVar7[uVar28] != (vrna_sc_t *)0x0) {
            local_f0.up_comparative[uVar28] = ppvVar7[uVar28]->energy_up;
            local_f0.user_cb_comparative[uVar28] = ppvVar7[uVar28]->f;
            local_f0.user_data_comparative[uVar28] = ppvVar7[uVar28]->data;
            if (ppvVar7[uVar28]->energy_up != (int **)0x0) {
              bVar55 = true;
            }
            if (ppvVar7[uVar28]->f != (vrna_callback_sc_energy *)0x0) {
              bVar16 = true;
            }
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 < (fc->field_23).field_1.n_seq);
        bVar55 = !bVar55;
        bVar16 = !bVar16;
      }
      if (bVar55) {
        if (!bVar16) {
          local_f0.decomp_stem1 = sc_user_f3_split_in_stem_ext1_comparative;
          local_f0.decomp_stem = sc_user_f3_split_in_stem_ext_comparative;
          local_f0.red_stem = sc_user_f3_reduce_to_stem_comparative;
          local_f0.red_ext = sc_user_f3_reduce_to_ext_comparative;
        }
      }
      else {
        local_f0.red_ext = sc_user_def_f3_reduce_to_ext_comparative;
        if (bVar16) {
          local_f0.red_ext = sc_default_f3_reduce_comparative;
        }
        local_f0.red_stem = sc_user_def_f3_reduce_to_stem_comparative;
        if (bVar16) {
          local_f0.red_stem = sc_default_f3_reduce_comparative;
        }
        local_f0.decomp_stem = sc_user_def_f3_split_in_stem_ext_comparative;
        if (bVar16) {
          local_f0.decomp_stem = sc_default_f3_split_in_stem_ext_comparative;
        }
        local_f0.decomp_stem1 = sc_user_def_f3_split_in_stem_ext1_comparative;
        if (bVar16) {
          local_f0.decomp_stem1 = sc_default_f3_split_in_stem_ext1_comparative;
        }
      }
    }
  }
  else if ((fc->type == VRNA_FC_TYPE_SINGLE) &&
          (pvVar6 = (fc->field_23).field_0.sc, pvVar6 != (vrna_sc_t *)0x0)) {
    local_f0.up = pvVar6->energy_up;
    local_f0.user_cb = pvVar6->f;
    local_f0.user_data = pvVar6->data;
    if (local_f0.up == (int **)0x0) {
      if (local_f0.user_cb != (vrna_callback_sc_energy *)0x0) {
        local_f0.decomp_stem1 = sc_user_f3_split_in_stem_ext1;
        local_f0.decomp_stem = sc_user_f3_split_in_stem_ext;
        local_f0.red_stem = sc_user_f3_reduce_to_stem;
        local_f0.red_ext = sc_user_f3_reduce_to_ext;
      }
    }
    else {
      bVar55 = local_f0.user_cb == (vrna_callback_sc_energy *)0x0;
      local_f0.red_ext = sc_user_def_f3_reduce_to_ext;
      if (bVar55) {
        local_f0.red_ext = sc_default_f3_reduce;
      }
      local_f0.red_stem = sc_user_def_f3_reduce_to_stem;
      if (bVar55) {
        local_f0.red_stem = sc_default_f3_reduce;
      }
      local_f0.decomp_stem = sc_user_def_f3_split_in_stem_ext;
      if (bVar55) {
        local_f0.decomp_stem = sc_default_f3_split_in_stem_ext;
      }
      local_f0.decomp_stem1 = sc_user_def_f3_split_in_stem_ext1;
      if (bVar55) {
        local_f0.decomp_stem1 = sc_default_f3_split_in_stem_ext1;
      }
    }
  }
  puVar17 = local_f0.red_ext;
  uVar4 = fc->length;
  piVar29 = (fc->matrices->field_2).field_0.f5;
  pvVar8 = fc->domains_up;
  lVar54 = (long)i;
  uVar28 = lVar54 + 1;
  local_114 = 10000000;
  iVar44 = (int)uVar28;
  if (piVar29[lVar54 + 1] != 10000000) {
    uVar19 = (*evaluate)(i,uVar4,iVar44,uVar4,'\f',&local_78);
    local_114 = 10000000;
    if ((uVar19 != '\0') && (local_114 = piVar29[uVar28], (code *)puVar17 != (code *)0x0)) {
      iVar20 = (*(code *)puVar17)(CONCAT44(in_register_00000034,i),uVar28 & 0xffffffff,uVar4,
                                  &local_f0);
      local_114 = local_114 + iVar20;
    }
  }
  if (((pvVar8 != (vrna_ud_t *)0x0) && (pvVar8->energy_cb != (vrna_callback_ud_energy *)0x0)) &&
     (0 < pvVar8->uniq_motif_count)) {
    lVar45 = 0;
    do {
      uVar51 = (int)pvVar8->uniq_motif_size[lVar45] + lVar54;
      iVar20 = (int)uVar51 + -1;
      if (((iVar20 <= (int)uVar4) && (piVar29[uVar51] != 10000000)) &&
         (uVar19 = (*evaluate)(i,uVar4,iVar20,uVar4,'\f',&local_78), uVar19 != '\0')) {
        iVar21 = piVar29[uVar51];
        iVar20 = (*pvVar8->energy_cb)(fc,i,iVar20,0x11,pvVar8->data);
        iVar20 = iVar20 + iVar21;
        if ((code *)puVar17 != (code *)0x0) {
          iVar21 = (*(code *)puVar17)(i,uVar51 & 0xffffffff,uVar4,&local_f0);
          iVar20 = iVar20 + iVar21;
        }
        if (iVar20 <= local_114) {
          local_114 = iVar20;
        }
      }
      lVar45 = lVar45 + 1;
    } while (lVar45 < pvVar8->uniq_motif_count);
  }
  uVar4 = fc->length;
  iVar20 = fc->window_size;
  lVar45 = (long)(int)uVar4;
  if (iVar22 == 2) {
    pvVar9 = fc->params;
    lVar43 = *(long *)((fc->matrices->field_2).field_0.c + lVar54 * 2);
    lVar30 = lVar43 + lVar54 * -4;
    iVar22 = (pvVar9->model_details).min_loop_size;
    pvVar31 = vrna_alloc(iVar20 * 4 + 0x18);
    puVar18 = local_f0.decomp_stem;
    puVar17 = local_f0.red_stem;
    if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
      uVar25 = (fc->field_23).field_1.n_seq;
      uVar28 = (ulong)uVar25;
      pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
      pvVar6 = (fc->field_23).field_0.sc;
      ppsVar14 = (fc->field_23).field_1.S3;
      ppuVar15 = (fc->field_23).field_1.a2s;
      uVar27 = iVar20 + i;
      uVar24 = uVar4 - 1;
      if ((int)uVar27 < (int)uVar4) {
        uVar24 = uVar27;
      }
      uVar25 = uVar25 * 2;
      pvVar32 = vrna_alloc(uVar25);
      pvVar33 = vrna_alloc(uVar25);
      if (uVar28 != 0) {
        uVar51 = 0;
        do {
          uVar35 = 0xffff;
          if (1 < ppuVar15[uVar51][lVar54]) {
            uVar35 = *(undefined2 *)(*(long *)(&pvVar6->type + uVar51 * 2) + lVar54 * 2);
          }
          *(undefined2 *)((long)pvVar32 + uVar51 * 2) = uVar35;
          *(undefined2 *)((long)pvVar33 + uVar51 * 2) =
               *(undefined2 *)(*(long *)(pcVar13 + uVar51 * 8) + lVar54 * 2);
          uVar51 = uVar51 + 1;
        } while (uVar28 != uVar51);
      }
      iVar22 = iVar22 + iVar44;
      if (iVar22 <= (int)uVar24) {
        lVar43 = (long)iVar22;
        do {
          *(undefined4 *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4) = 10000000;
          if ((*(int *)(lVar30 + lVar43 * 4) != 10000000) &&
             (uVar19 = (*evaluate)(i,uVar4,(int)lVar43,(int)lVar43 + 1,'\x10',&local_78),
             uVar19 != '\0')) {
            iVar21 = *(int *)(lVar30 + lVar43 * 4);
            if (uVar28 != 0) {
              uVar51 = 0;
              do {
                uVar25 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar51 * 2),
                                           (int)*(short *)(*(long *)(pcVar13 + uVar51 * 8) +
                                                          lVar43 * 2),&pvVar9->model_details);
                puVar12 = ppuVar15[uVar51];
                uVar41 = 0xffffffff;
                if (puVar12[lVar43] < puVar12[uVar4]) {
                  uVar41 = (uint)ppsVar14[uVar51][lVar43];
                }
                sVar3 = *(short *)((long)pvVar32 + uVar51 * 2);
                uVar40 = (uint)sVar3;
                if ((int)(uVar41 | uVar40) < 0) {
                  if (-1 < sVar3) {
                    piVar29 = pvVar9->dangle5[uVar25] + uVar40;
                    goto LAB_0011d930;
                  }
                  paaiVar49 = (int (*) [5] [5])pvVar9->dangle3;
                  uVar40 = uVar25;
                  if (-1 < (int)uVar41) goto LAB_0011d90c;
                  iVar50 = 0;
                }
                else {
                  paaiVar49 = pvVar9->mismatchExt + uVar25;
LAB_0011d90c:
                  piVar29 = (*paaiVar49)[uVar40] + uVar41;
LAB_0011d930:
                  iVar50 = *piVar29;
                }
                if (2 < uVar25) {
                  iVar50 = iVar50 + pvVar9->TerminalAU;
                }
                iVar21 = iVar21 + iVar50;
                uVar51 = uVar51 + 1;
              } while (uVar28 != uVar51);
            }
            *(int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4) = iVar21;
          }
          bVar55 = lVar43 < (int)uVar24;
          lVar43 = lVar43 + 1;
        } while (bVar55);
      }
      if ((code *)puVar18 != (code *)0x0 && iVar22 <= (int)uVar24) {
        lVar43 = (long)iVar22 + -1;
        do {
          if (*(int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4 + 4) != 10000000) {
            iVar21 = (*(code *)puVar18)(i,iVar22,iVar22 + 1,&local_f0);
            piVar29 = (int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4 + 4);
            *piVar29 = *piVar29 + iVar21;
          }
          lVar43 = lVar43 + 1;
          iVar22 = iVar22 + 1;
        } while (lVar43 < (int)uVar24);
      }
      if (((uVar4 <= uVar27) &&
          (*(undefined4 *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4) = 10000000,
          *(int *)(lVar30 + lVar45 * 4) != 10000000)) &&
         (uVar19 = (*evaluate)(i,uVar4,i,uVar4,'\x0e',&local_78), uVar19 != '\0')) {
        iVar22 = *(int *)(lVar30 + lVar45 * 4);
        if (uVar28 != 0) {
          uVar51 = 0;
          do {
            uVar25 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar51 * 2),
                                       (int)*(short *)(*(long *)(pcVar13 + uVar51 * 8) + lVar45 * 2)
                                       ,&pvVar9->model_details);
            lVar43 = (long)*(short *)((long)pvVar32 + uVar51 * 2);
            iVar21 = 0;
            if (-1 < lVar43) {
              iVar21 = pvVar9->dangle5[uVar25][lVar43];
            }
            if (2 < uVar25) {
              iVar21 = iVar21 + pvVar9->TerminalAU;
            }
            iVar22 = iVar22 + iVar21;
            uVar51 = uVar51 + 1;
          } while (uVar28 != uVar51);
        }
        if ((code *)puVar17 != (code *)0x0) {
          iVar21 = (*(code *)puVar17)(i,i,(ulong)uVar4,&local_f0);
          iVar22 = iVar22 + iVar21;
        }
        *(int *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4) = iVar22;
      }
      free(pvVar32);
      free(pvVar33);
    }
    else if (fc->type == VRNA_FC_TYPE_SINGLE) {
      psVar10 = (fc->field_23).field_0.sequence_encoding;
      local_1d0 = 0xffffffff;
      if (1 < i) {
        local_1d0 = (uint)psVar10[(ulong)(uint)i - 1];
      }
      ppcVar11 = fc->ptype_local;
      uVar24 = iVar20 + i;
      uVar25 = uVar4 - 1;
      if ((int)uVar24 < (int)uVar4) {
        uVar25 = uVar24;
      }
      iVar21 = iVar22 + iVar44;
      lVar53 = (long)iVar21;
      if (iVar21 <= (int)uVar25) {
        local_88 = pvVar9->dangle3;
        lVar46 = lVar53 * 4 + lVar54 * -4;
        lVar43 = lVar43 + lVar46;
        lVar47 = 0;
        do {
          *(undefined4 *)((long)pvVar31 + lVar47 * 4 + lVar46) = 10000000;
          if (*(int *)(lVar43 + lVar47 * 4) != 10000000) {
            iVar50 = iVar22 + i + (int)lVar47 + 1;
            uVar19 = (*evaluate)(i,uVar4,iVar50,iVar22 + i + (int)lVar47 + 2,'\x10',&local_78);
            if (uVar19 != '\0') {
              uVar27 = vrna_get_ptype_window(i,iVar50,ppcVar11);
              sVar3 = psVar10[lVar53 + lVar47 + 1];
              if ((int)(local_1d0 | (int)sVar3) < 0) {
                if (-1 < (int)local_1d0) {
                  piVar29 = pvVar9->dangle5[uVar27] + local_1d0;
                  goto LAB_0011e026;
                }
                if (-1 < sVar3) {
                  paiVar42 = local_88 + uVar27;
                  goto LAB_0011e001;
                }
                iVar50 = 0;
              }
              else {
                paiVar42 = pvVar9->mismatchExt[uVar27] + local_1d0;
LAB_0011e001:
                piVar29 = *paiVar42 + (uint)(int)sVar3;
LAB_0011e026:
                iVar50 = *piVar29;
              }
              if (2 < uVar27) {
                iVar50 = iVar50 + pvVar9->TerminalAU;
              }
              *(int *)((long)pvVar31 + lVar47 * 4 + lVar46) = iVar50 + *(int *)(lVar43 + lVar47 * 4)
              ;
            }
          }
          lVar52 = lVar53 + lVar47;
          lVar47 = lVar47 + 1;
        } while (lVar52 < (int)uVar25);
      }
      if ((code *)puVar18 != (code *)0x0 && iVar21 <= (int)uVar25) {
        lVar53 = lVar53 + -1;
        do {
          if (*(int *)((long)pvVar31 + lVar53 * 4 + lVar54 * -4 + 4) != 10000000) {
            iVar22 = (*(code *)puVar18)(i,iVar21,iVar21 + 1,&local_f0);
            piVar29 = (int *)((long)pvVar31 + lVar53 * 4 + lVar54 * -4 + 4);
            *piVar29 = *piVar29 + iVar22;
          }
          lVar53 = lVar53 + 1;
          iVar21 = iVar21 + 1;
        } while (lVar53 < (int)uVar25);
      }
      if (((uVar4 <= uVar24) &&
          (*(undefined4 *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4) = 10000000,
          *(int *)(lVar30 + lVar45 * 4) != 10000000)) &&
         (uVar19 = (*evaluate)(i,uVar4,i,uVar4,'\x0e',&local_78), uVar19 != '\0')) {
        uVar25 = vrna_get_ptype_window(i,uVar4,ppcVar11);
        if ((int)local_1d0 < 0) {
          iVar22 = 0;
        }
        else {
          iVar22 = pvVar9->dangle5[uVar25][local_1d0];
        }
        if (2 < uVar25) {
          iVar22 = iVar22 + pvVar9->TerminalAU;
        }
        *(int *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4) = iVar22 + *(int *)(lVar30 + lVar45 * 4);
        if ((code *)puVar17 != (code *)0x0) {
          iVar22 = (*(code *)puVar17)(i,i,uVar4,&local_f0);
          piVar29 = (int *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4);
          *piVar29 = *piVar29 + iVar22;
        }
      }
    }
    iVar20 = iVar20 + i;
    iVar22 = uVar4 - 1;
    if (iVar20 < (int)uVar4) {
      iVar22 = iVar20;
    }
    iVar21 = (fc->params->model_details).min_loop_size;
    iVar22 = vrna_fun_zip_add_min
                       ((int *)((long)pvVar31 + (long)iVar21 * 4 + 4),
                        (fc->matrices->field_2).field_0.f5 + lVar54 + (long)iVar21 + 2,
                        (iVar22 - iVar21) - i);
    if (((int)uVar4 <= iVar20) &&
       (iVar20 = *(int *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4), iVar20 <= iVar22)) {
      iVar22 = iVar20;
    }
    free(pvVar31);
    if (local_114 < iVar22) {
      iVar22 = local_114;
    }
    goto LAB_0011f268;
  }
  if (iVar22 == 0) {
    piVar29 = f3_get_stem_contributions_d0(fc,i,evaluate,&local_78,&local_f0);
    iVar20 = iVar20 + i;
    iVar22 = uVar4 - 1;
    if (iVar20 < (int)uVar4) {
      iVar22 = iVar20;
    }
    iVar21 = (fc->params->model_details).min_loop_size;
    iVar22 = vrna_fun_zip_add_min
                       (piVar29 + lVar54 + (long)iVar21 + 1,
                        (fc->matrices->field_2).field_0.f5 + lVar54 + (long)iVar21 + 2,
                        (iVar22 - iVar21) - i);
    if (((int)uVar4 <= iVar20) && (piVar29[lVar45] <= iVar22)) {
      iVar22 = piVar29[lVar45];
    }
    free(piVar29 + lVar54);
    if (local_114 < iVar22) {
      iVar22 = local_114;
    }
    goto LAB_0011f268;
  }
  piVar29 = f3_get_stem_contributions_d0(fc,i,evaluate,&local_78,&local_f0);
  iVar20 = iVar20 + i;
  iVar22 = uVar4 - 1;
  if (iVar20 < (int)uVar4) {
    iVar22 = iVar20;
  }
  iVar21 = (fc->params->model_details).min_loop_size;
  iVar22 = vrna_fun_zip_add_min
                     (piVar29 + lVar54 + (long)iVar21 + 1,
                      (fc->matrices->field_2).field_0.f5 + lVar54 + (long)iVar21 + 2,
                      (iVar22 - iVar21) - i);
  if (((int)uVar4 <= iVar20) && (piVar29[lVar45] <= iVar22)) {
    iVar22 = piVar29[lVar45];
  }
  local_88 = (int (*) [5])CONCAT44(local_88._4_4_,iVar22);
  free(piVar29 + lVar54);
  uVar25 = fc->length;
  lVar53 = (long)(int)uVar25;
  iVar22 = fc->window_size;
  pvVar9 = fc->params;
  lVar43 = *(long *)((fc->matrices->field_2).field_0.c + lVar54 * 2);
  lVar30 = lVar43 + lVar54 * -4;
  iVar21 = (pvVar9->model_details).min_loop_size;
  pvVar31 = vrna_alloc(iVar22 * 4 + 0x18);
  puVar18 = local_f0.decomp_stem;
  puVar17 = local_f0.red_stem;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar24 = (fc->field_23).field_1.n_seq;
    uVar51 = (ulong)uVar24;
    pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
    ppsVar14 = (fc->field_23).field_1.S3;
    ppuVar15 = (fc->field_23).field_1.a2s;
    iVar36 = uVar25 - 1;
    iVar50 = iVar22 + i + 1;
    if ((int)uVar25 <= iVar50) {
      iVar50 = iVar36;
    }
    pvVar32 = vrna_alloc(uVar24 * 2);
    if (uVar51 != 0) {
      uVar34 = 0;
      do {
        *(undefined2 *)((long)pvVar32 + uVar34 * 2) =
             *(undefined2 *)(*(long *)(pcVar13 + uVar34 * 8) + lVar54 * 2);
        uVar34 = uVar34 + 1;
      } while (uVar51 != uVar34);
    }
    iVar21 = iVar21 + iVar44;
    if (iVar21 <= iVar50) {
      lVar43 = (long)iVar21;
      do {
        *(undefined4 *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4) = 10000000;
        if ((*(int *)(lVar30 + -4 + lVar43 * 4) != 10000000) &&
           (uVar19 = (*evaluate)(i,uVar25,(int)lVar43 + -1,(int)lVar43 + 1,'\x10',&local_78),
           uVar19 != '\0')) {
          iVar23 = *(int *)(lVar30 + -4 + lVar43 * 4);
          if (uVar51 != 0) {
            uVar34 = 0;
            do {
              uVar24 = vrna_get_ptype_md((int)*(short *)((long)pvVar32 + uVar34 * 2),
                                         (int)*(short *)(*(long *)(pcVar13 + uVar34 * 8) + -2 +
                                                        lVar43 * 2),&pvVar9->model_details);
              puVar12 = ppuVar15[uVar34];
              uVar27 = 0xffffffff;
              if (puVar12[lVar43 + -1] < puVar12[lVar53]) {
                uVar27 = (uint)ppsVar14[uVar34][lVar43 + -1];
              }
              if ((int)uVar27 < 0) {
                iVar37 = 0;
              }
              else {
                iVar37 = pvVar9->dangle3[uVar24][uVar27];
              }
              if (2 < uVar24) {
                iVar37 = iVar37 + pvVar9->TerminalAU;
              }
              iVar23 = iVar23 + iVar37;
              uVar34 = uVar34 + 1;
            } while (uVar51 != uVar34);
          }
          *(int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4) = iVar23;
        }
        bVar55 = lVar43 < iVar50;
        lVar43 = lVar43 + 1;
      } while (bVar55);
    }
    if ((code *)puVar18 != (code *)0x0 && iVar21 <= iVar50) {
      uVar34 = (long)iVar21 - 1;
      do {
        if (*(int *)((long)pvVar31 + uVar34 * 4 + lVar54 * -4 + 4) != 10000000) {
          iVar21 = (*(code *)puVar18)(i,uVar34 & 0xffffffff,(int)uVar34 + 2,&local_f0);
          piVar29 = (int *)((long)pvVar31 + uVar34 * 4 + lVar54 * -4 + 4);
          *piVar29 = *piVar29 + iVar21;
        }
        uVar34 = uVar34 + 1;
      } while ((long)uVar34 < (long)iVar50);
    }
    if ((((int)uVar25 <= iVar22 + i) && (*(int *)(lVar30 + -4 + lVar53 * 4) != 10000000)) &&
       (uVar19 = (*evaluate)(i,uVar25,i,iVar36,'\x0e',&local_78), uVar19 != '\0')) {
      iVar22 = *(int *)(lVar30 + -4 + lVar53 * 4);
      if (uVar51 != 0) {
        uVar34 = 0;
        do {
          uVar25 = vrna_get_ptype_md((int)*(short *)((long)pvVar32 + uVar34 * 2),
                                     (int)*(short *)(*(long *)(pcVar13 + uVar34 * 8) + -2 +
                                                    lVar53 * 2),&pvVar9->model_details);
          puVar12 = ppuVar15[uVar34];
          uVar24 = 0xffffffff;
          if (puVar12[lVar53 + -1] < puVar12[lVar53]) {
            uVar24 = (uint)ppsVar14[uVar34][lVar53 + -1];
          }
          if ((int)uVar24 < 0) {
            iVar21 = 0;
          }
          else {
            iVar21 = pvVar9->dangle3[uVar25][uVar24];
          }
          if (2 < uVar25) {
            iVar21 = iVar21 + pvVar9->TerminalAU;
          }
          iVar22 = iVar22 + iVar21;
          uVar34 = uVar34 + 1;
        } while (uVar51 != uVar34);
      }
      if ((code *)puVar17 != (code *)0x0) {
        iVar21 = (*(code *)puVar17)(i,i,iVar36,&local_f0);
        iVar22 = iVar22 + iVar21;
      }
      *(int *)((long)pvVar31 + lVar53 * 4 + lVar54 * -4) = iVar22;
    }
    free(pvVar32);
  }
  else if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar10 = (fc->field_23).field_0.sequence_encoding;
    ppcVar11 = fc->ptype_local;
    iVar36 = uVar25 - 1;
    iVar50 = iVar22 + i + 1;
    if ((int)uVar25 <= iVar50) {
      iVar50 = iVar36;
    }
    iVar23 = iVar21 + iVar44;
    if (iVar23 <= iVar50) {
      lVar46 = (long)iVar23;
      lVar47 = lVar46 * 4 + lVar54 * -4;
      lVar43 = lVar47 + lVar43 + -4;
      lVar52 = 0;
      do {
        *(undefined4 *)((long)pvVar31 + lVar52 * 4 + lVar47) = 10000000;
        if (*(int *)(lVar43 + lVar52 * 4) != 10000000) {
          iVar37 = iVar21 + i + (int)lVar52;
          uVar19 = (*evaluate)(i,uVar25,iVar37,iVar37 + 2,'\x10',&local_78);
          if (uVar19 != '\0') {
            uVar24 = vrna_get_ptype_window(i,iVar37,ppcVar11);
            lVar39 = (long)psVar10[lVar46 + lVar52];
            if (lVar39 < 0) {
              iVar37 = 0;
            }
            else {
              iVar37 = pvVar9->dangle3[uVar24][lVar39];
            }
            if (2 < uVar24) {
              iVar37 = iVar37 + pvVar9->TerminalAU;
            }
            *(int *)((long)pvVar31 + lVar52 * 4 + lVar47) = iVar37 + *(int *)(lVar43 + lVar52 * 4);
          }
        }
        lVar39 = lVar46 + lVar52;
        lVar52 = lVar52 + 1;
      } while (lVar39 < iVar50);
    }
    if ((code *)puVar18 != (code *)0x0 && iVar23 <= iVar50) {
      uVar51 = (long)iVar23 - 1;
      do {
        if (*(int *)((long)pvVar31 + uVar51 * 4 + lVar54 * -4 + 4) != 10000000) {
          iVar21 = (*(code *)puVar18)(i,uVar51 & 0xffffffff,(int)uVar51 + 2,&local_f0);
          piVar29 = (int *)((long)pvVar31 + uVar51 * 4 + lVar54 * -4 + 4);
          *piVar29 = *piVar29 + iVar21;
        }
        uVar51 = uVar51 + 1;
      } while ((long)uVar51 < (long)iVar50);
    }
    if ((((int)uVar25 <= iVar22 + i) && (*(int *)(lVar30 + -4 + lVar53 * 4) != 10000000)) &&
       (uVar19 = (*evaluate)(i,uVar25,i,iVar36,'\x0e',&local_78), uVar19 != '\0')) {
      uVar25 = vrna_get_ptype_window(i,iVar36,ppcVar11);
      lVar43 = (long)psVar10[lVar53];
      if (lVar43 < 0) {
        iVar22 = 0;
      }
      else {
        iVar22 = pvVar9->dangle3[uVar25][lVar43];
      }
      if (2 < uVar25) {
        iVar22 = iVar22 + pvVar9->TerminalAU;
      }
      *(int *)((long)pvVar31 + lVar53 * 4 + lVar54 * -4) =
           iVar22 + *(int *)(lVar30 + -4 + lVar53 * 4);
      if ((code *)puVar17 != (code *)0x0) {
        iVar22 = (*(code *)puVar17)(i,i,iVar36,&local_f0);
        piVar29 = (int *)((long)pvVar31 + lVar53 * 4 + lVar54 * -4);
        *piVar29 = *piVar29 + iVar22;
      }
    }
  }
  iVar21 = uVar4 - 1;
  if (iVar20 + 1 < (int)uVar4) {
    iVar21 = iVar20 + 1;
  }
  iVar22 = (fc->params->model_details).min_loop_size;
  iVar22 = vrna_fun_zip_add_min
                     ((int *)((long)pvVar31 + (long)iVar22 * 4 + 4),
                      (fc->matrices->field_2).field_0.f5 + lVar54 + (long)iVar22 + 2,
                      (iVar21 - iVar22) - i);
  if (((int)uVar4 <= iVar20) &&
     (iVar50 = *(int *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4), iVar50 <= iVar22)) {
    iVar22 = iVar50;
  }
  free(pvVar31);
  uVar25 = fc->length;
  lVar30 = (long)(int)uVar25;
  iVar50 = fc->window_size;
  pvVar9 = fc->params;
  lVar43 = *(long *)((fc->matrices->field_2).field_0.c + uVar28 * 2);
  lVar53 = lVar43 + uVar28 * -4;
  iVar36 = (pvVar9->model_details).min_loop_size;
  pvVar31 = vrna_alloc(iVar50 * 4 + 0x18);
  puVar18 = local_f0.decomp_stem1;
  puVar17 = local_f0.red_stem;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar24 = (fc->field_23).field_1.n_seq;
    uVar51 = (ulong)uVar24;
    pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar6 = (fc->field_23).field_0.sc;
    ppuVar15 = (fc->field_23).field_1.a2s;
    iVar37 = iVar50 + i + 1;
    iVar23 = uVar25 - 1;
    if (iVar37 < (int)uVar25) {
      iVar23 = iVar37;
    }
    uVar24 = uVar24 * 2;
    pvVar32 = vrna_alloc(uVar24);
    pvVar33 = vrna_alloc(uVar24);
    if (uVar51 != 0) {
      uVar34 = 0;
      do {
        uVar35 = 0xffff;
        if (1 < ppuVar15[uVar34][uVar28]) {
          uVar35 = *(undefined2 *)(*(long *)(&pvVar6->type + uVar34 * 2) + uVar28 * 2);
        }
        *(undefined2 *)((long)pvVar32 + uVar34 * 2) = uVar35;
        *(undefined2 *)((long)pvVar33 + uVar34 * 2) =
             *(undefined2 *)(*(long *)(pcVar13 + uVar34 * 8) + uVar28 * 2);
        uVar34 = uVar34 + 1;
      } while (uVar51 != uVar34);
    }
    iVar36 = iVar36 + iVar44;
    if (iVar36 <= iVar23) {
      lVar43 = (long)iVar36;
      do {
        *(undefined4 *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4) = 10000000;
        if ((*(int *)(lVar53 + lVar43 * 4) != 10000000) &&
           (uVar19 = (*evaluate)(i,uVar25,(int)lVar43,(int)lVar43 + 1,'\x14',&local_78),
           uVar19 != '\0')) {
          iVar37 = *(int *)(lVar53 + lVar43 * 4);
          if (uVar51 != 0) {
            uVar34 = 0;
            do {
              uVar24 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar34 * 2),
                                         (int)*(short *)(*(long *)(pcVar13 + uVar34 * 8) +
                                                        lVar43 * 2),&pvVar9->model_details);
              lVar46 = (long)*(short *)((long)pvVar32 + uVar34 * 2);
              if (lVar46 < 0) {
                iVar48 = 0;
              }
              else {
                iVar48 = pvVar9->dangle5[uVar24][lVar46];
              }
              if (2 < uVar24) {
                iVar48 = iVar48 + pvVar9->TerminalAU;
              }
              iVar37 = iVar37 + iVar48;
              uVar34 = uVar34 + 1;
            } while (uVar51 != uVar34);
          }
          *(int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4) = iVar37;
        }
        bVar55 = lVar43 < iVar23;
        lVar43 = lVar43 + 1;
      } while (bVar55);
    }
    if ((code *)puVar18 != (code *)0x0 && iVar36 <= iVar23) {
      lVar43 = (long)iVar36 + -1;
      do {
        if (*(int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4 + 4) != 10000000) {
          iVar37 = (*(code *)puVar18)(i,iVar36,iVar36 + 1,&local_f0);
          piVar29 = (int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4 + 4);
          *piVar29 = *piVar29 + iVar37;
        }
        lVar43 = lVar43 + 1;
        iVar36 = iVar36 + 1;
      } while (lVar43 < iVar23);
    }
    if ((((int)uVar25 <= iVar50 + i) &&
        (*(undefined4 *)((long)pvVar31 + lVar30 * 4 + lVar54 * -4) = 10000000,
        *(int *)(lVar53 + lVar30 * 4) != 10000000)) &&
       (uVar19 = (*evaluate)(i,uVar25,iVar44,uVar25,'\x0e',&local_78), uVar19 != '\0')) {
      iVar50 = *(int *)(lVar53 + lVar30 * 4);
      if (uVar51 != 0) {
        uVar34 = 0;
        do {
          uVar24 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar34 * 2),
                                     (int)*(short *)(*(long *)(pcVar13 + uVar34 * 8) + lVar30 * 2),
                                     &pvVar9->model_details);
          lVar43 = (long)*(short *)((long)pvVar32 + uVar34 * 2);
          iVar36 = 0;
          if (-1 < lVar43) {
            iVar36 = pvVar9->dangle5[uVar24][lVar43];
          }
          if (2 < uVar24) {
            iVar36 = iVar36 + pvVar9->TerminalAU;
          }
          iVar50 = iVar50 + iVar36;
          uVar34 = uVar34 + 1;
        } while (uVar51 != uVar34);
      }
      if ((code *)puVar17 != (code *)0x0) {
        iVar36 = (*(code *)puVar17)(i,uVar28,uVar25,&local_f0);
        iVar50 = iVar50 + iVar36;
      }
      *(int *)((long)pvVar31 + lVar30 * 4 + lVar54 * -4) = iVar50;
    }
    free(pvVar32);
    free(pvVar33);
  }
  else if (fc->type == VRNA_FC_TYPE_SINGLE) {
    ppcVar11 = fc->ptype_local;
    uVar1 = (fc->field_23).field_0.sequence_encoding[lVar54];
    iVar37 = iVar50 + i + 1;
    iVar23 = uVar25 - 1;
    if (iVar37 < (int)uVar25) {
      iVar23 = iVar37;
    }
    iVar37 = iVar44 + iVar36;
    if (iVar37 <= iVar23) {
      lVar47 = (long)iVar37 * 4;
      lVar43 = lVar43 + lVar47 + uVar28 * -4;
      lVar47 = lVar47 + lVar54 * -4;
      lVar46 = 0;
      do {
        *(undefined4 *)((long)pvVar31 + lVar46 * 4 + lVar47) = 10000000;
        if (*(int *)(lVar43 + lVar46 * 4) != 10000000) {
          iVar48 = iVar36 + i + (int)lVar46 + 1;
          uVar19 = (*evaluate)(i,uVar25,iVar48,iVar36 + i + (int)lVar46 + 2,'\x14',&local_78);
          if (uVar19 != '\0') {
            uVar24 = vrna_get_ptype_window(iVar44,iVar48,ppcVar11);
            if ((short)uVar1 < 0) {
              iVar48 = 0;
            }
            else {
              iVar48 = pvVar9->dangle5[uVar24][uVar1];
            }
            if (2 < uVar24) {
              iVar48 = iVar48 + pvVar9->TerminalAU;
            }
            *(int *)((long)pvVar31 + lVar46 * 4 + lVar47) = iVar48 + *(int *)(lVar43 + lVar46 * 4);
          }
        }
        lVar52 = iVar37 + lVar46;
        lVar46 = lVar46 + 1;
      } while (lVar52 < iVar23);
    }
    if ((code *)puVar18 != (code *)0x0 && iVar37 <= iVar23) {
      lVar43 = (long)iVar37 + -1;
      do {
        if (*(int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4 + 4) != 10000000) {
          iVar36 = (*(code *)puVar18)(i,iVar37,iVar37 + 1,&local_f0);
          piVar29 = (int *)((long)pvVar31 + lVar43 * 4 + lVar54 * -4 + 4);
          *piVar29 = *piVar29 + iVar36;
        }
        lVar43 = lVar43 + 1;
        iVar37 = iVar37 + 1;
      } while (lVar43 < iVar23);
    }
    if ((((int)uVar25 <= iVar50 + i) &&
        (*(undefined4 *)((long)pvVar31 + lVar30 * 4 + lVar54 * -4) = 10000000,
        *(int *)(lVar53 + lVar30 * 4) != 10000000)) &&
       (uVar19 = (*evaluate)(i,uVar25,iVar44,uVar25,'\x0e',&local_78), uVar19 != '\0')) {
      uVar24 = vrna_get_ptype_window(iVar44,uVar25,ppcVar11);
      if ((short)uVar1 < 0) {
        iVar50 = 0;
      }
      else {
        iVar50 = pvVar9->dangle5[uVar24][uVar1];
      }
      if (2 < uVar24) {
        iVar50 = iVar50 + pvVar9->TerminalAU;
      }
      *(int *)((long)pvVar31 + lVar30 * 4 + lVar54 * -4) = iVar50 + *(int *)(lVar53 + lVar30 * 4);
      if ((code *)puVar17 != (code *)0x0) {
        iVar50 = (*(code *)puVar17)(i,uVar28 & 0xffffffff,uVar25,&local_f0);
        piVar29 = (int *)((long)pvVar31 + lVar30 * 4 + lVar54 * -4);
        *piVar29 = *piVar29 + iVar50;
      }
    }
  }
  iVar50 = (fc->params->model_details).min_loop_size;
  iVar50 = vrna_fun_zip_add_min
                     ((int *)((long)pvVar31 + (long)iVar50 * 4 + 4),
                      (fc->matrices->field_2).field_0.f5 + lVar54 + (long)iVar50 + 2,
                      (iVar21 - iVar50) - i);
  if (((int)uVar4 <= iVar20) &&
     (iVar36 = *(int *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4), iVar36 <= iVar50)) {
    iVar50 = iVar36;
  }
  free(pvVar31);
  uVar25 = fc->length;
  lVar53 = (long)(int)uVar25;
  iVar36 = fc->window_size;
  pvVar9 = fc->params;
  lVar30 = *(long *)((fc->matrices->field_2).field_0.c + uVar28 * 2);
  lVar43 = lVar30 + uVar28 * -4;
  iVar23 = (pvVar9->model_details).min_loop_size;
  pvVar31 = vrna_alloc(iVar36 * 4 + 0x18);
  puVar18 = local_f0.decomp_stem1;
  puVar17 = local_f0.red_stem;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar24 = (fc->field_23).field_1.n_seq;
    uVar51 = (ulong)uVar24;
    pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar6 = (fc->field_23).field_0.sc;
    ppsVar14 = (fc->field_23).field_1.S3;
    ppuVar15 = (fc->field_23).field_1.a2s;
    iVar48 = uVar25 - 1;
    iVar37 = iVar36 + i + 1;
    if ((int)uVar25 <= iVar37) {
      iVar37 = iVar48;
    }
    uVar24 = uVar24 * 2;
    pvVar32 = vrna_alloc(uVar24);
    pvVar33 = vrna_alloc(uVar24);
    if (uVar51 != 0) {
      uVar34 = 0;
      do {
        uVar35 = 0xffff;
        if (1 < ppuVar15[uVar34][uVar28]) {
          uVar35 = *(undefined2 *)(*(long *)(&pvVar6->type + uVar34 * 2) + uVar28 * 2);
        }
        *(undefined2 *)((long)pvVar32 + uVar34 * 2) = uVar35;
        *(undefined2 *)((long)pvVar33 + uVar34 * 2) =
             *(undefined2 *)(*(long *)(pcVar13 + uVar34 * 8) + uVar28 * 2);
        uVar34 = uVar34 + 1;
      } while (uVar51 != uVar34);
    }
    iVar23 = iVar23 + iVar44;
    if (iVar23 <= iVar37) {
      lVar30 = (long)iVar23;
      do {
        *(undefined4 *)((long)pvVar31 + lVar30 * 4 + lVar54 * -4) = 10000000;
        if ((*(int *)(lVar43 + -4 + lVar30 * 4) != 10000000) &&
           (uVar19 = (*evaluate)(i,uVar25,(int)lVar30 + -1,(int)lVar30 + 1,'\x14',&local_78),
           uVar19 != '\0')) {
          iVar26 = *(int *)(lVar43 + -4 + lVar30 * 4);
          if (uVar51 != 0) {
            uVar34 = 0;
            do {
              uVar24 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar34 * 2),
                                         (int)*(short *)(*(long *)(pcVar13 + uVar34 * 8) + -2 +
                                                        lVar30 * 2),&pvVar9->model_details);
              uVar27 = 0xffffffff;
              if (ppuVar15[uVar34][lVar30 + -1] < ppuVar15[uVar34][lVar53]) {
                uVar27 = (uint)ppsVar14[uVar34][lVar30 + -1];
              }
              sVar3 = *(short *)((long)pvVar32 + uVar34 * 2);
              uVar41 = (uint)sVar3;
              if ((int)(uVar27 | uVar41) < 0) {
                if (-1 < sVar3) {
                  piVar29 = pvVar9->dangle5[uVar24] + uVar41;
                  goto LAB_0011ed69;
                }
                paaiVar49 = (int (*) [5] [5])pvVar9->dangle3;
                uVar41 = uVar24;
                if (-1 < (int)uVar27) goto LAB_0011ed45;
                iVar38 = 0;
              }
              else {
                paaiVar49 = pvVar9->mismatchExt + uVar24;
LAB_0011ed45:
                piVar29 = (*paaiVar49)[uVar41] + uVar27;
LAB_0011ed69:
                iVar38 = *piVar29;
              }
              if (2 < uVar24) {
                iVar38 = iVar38 + pvVar9->TerminalAU;
              }
              iVar26 = iVar26 + iVar38;
              uVar34 = uVar34 + 1;
            } while (uVar51 != uVar34);
          }
          *(int *)((long)pvVar31 + lVar30 * 4 + lVar54 * -4) = iVar26;
        }
        bVar55 = lVar30 < iVar37;
        lVar30 = lVar30 + 1;
      } while (bVar55);
    }
    if ((code *)puVar18 != (code *)0x0 && iVar23 <= iVar37) {
      uVar34 = (long)iVar23 - 1;
      do {
        if (*(int *)((long)pvVar31 + uVar34 * 4 + lVar54 * -4 + 4) != 10000000) {
          iVar23 = (*(code *)puVar18)(i,uVar34 & 0xffffffff,(int)uVar34 + 2,&local_f0);
          piVar29 = (int *)((long)pvVar31 + uVar34 * 4 + lVar54 * -4 + 4);
          *piVar29 = *piVar29 + iVar23;
        }
        uVar34 = uVar34 + 1;
      } while ((long)uVar34 < (long)iVar37);
    }
    if ((((int)uVar25 <= iVar36 + i) && (*(int *)(lVar43 + -4 + lVar53 * 4) != 10000000)) &&
       (uVar19 = (*evaluate)(i,uVar25,iVar44,iVar48,'\x0e',&local_78), uVar19 != '\0')) {
      iVar36 = *(int *)(lVar43 + -4 + lVar53 * 4);
      if (uVar51 != 0) {
        uVar34 = 0;
        do {
          uVar25 = vrna_get_ptype_md((int)*(short *)((long)pvVar33 + uVar34 * 2),
                                     (int)*(short *)(*(long *)(pcVar13 + uVar34 * 8) + -2 +
                                                    lVar53 * 2),&pvVar9->model_details);
          uVar24 = 0xffffffff;
          if (ppuVar15[uVar34][lVar53 + -1] < ppuVar15[uVar34][lVar53]) {
            uVar24 = (uint)ppsVar14[uVar34][lVar53 + -1];
          }
          sVar3 = *(short *)((long)pvVar32 + uVar34 * 2);
          uVar27 = (uint)sVar3;
          if ((int)(uVar24 | uVar27) < 0) {
            if (-1 < sVar3) {
              piVar29 = pvVar9->dangle5[uVar25] + uVar27;
              goto LAB_0011ef51;
            }
            paaiVar49 = (int (*) [5] [5])pvVar9->dangle3;
            uVar27 = uVar25;
            if (-1 < (int)uVar24) goto LAB_0011ef2d;
            iVar23 = 0;
          }
          else {
            paaiVar49 = pvVar9->mismatchExt + uVar25;
LAB_0011ef2d:
            piVar29 = (*paaiVar49)[uVar27] + uVar24;
LAB_0011ef51:
            iVar23 = *piVar29;
          }
          if (2 < uVar25) {
            iVar23 = iVar23 + pvVar9->TerminalAU;
          }
          iVar36 = iVar36 + iVar23;
          uVar34 = uVar34 + 1;
        } while (uVar51 != uVar34);
      }
      if ((code *)puVar17 != (code *)0x0) {
        iVar23 = (*(code *)puVar17)(i,uVar28,iVar48,&local_f0);
        iVar36 = iVar36 + iVar23;
      }
      *(int *)((long)pvVar31 + lVar53 * 4 + lVar54 * -4) = iVar36;
    }
    free(pvVar32);
    free(pvVar33);
  }
  else if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar10 = (fc->field_23).field_0.sequence_encoding;
    ppcVar11 = fc->ptype_local;
    uVar1 = psVar10[lVar54];
    uVar24 = (uint)(short)uVar1;
    iVar48 = uVar25 - 1;
    iVar37 = iVar36 + i + 1;
    if ((int)uVar25 <= iVar37) {
      iVar37 = iVar48;
    }
    iVar26 = iVar44 + iVar23;
    local_40 = psVar10;
    if (iVar26 <= iVar37) {
      local_38 = pvVar9->dangle3;
      lVar47 = (long)iVar26;
      lVar46 = lVar30 + lVar47 * 4 + uVar28 * -4 + -4;
      lVar52 = lVar47 * 4 + lVar54 * -4;
      lVar30 = 0;
      do {
        *(undefined4 *)((long)pvVar31 + lVar30 * 4 + lVar52) = 10000000;
        if (*(int *)(lVar46 + lVar30 * 4) != 10000000) {
          iVar38 = iVar23 + i + (int)lVar30;
          uVar19 = (*evaluate)(i,uVar25,iVar38,iVar38 + 2,'\x14',&local_78);
          if (uVar19 != '\0') {
            uVar27 = vrna_get_ptype_window(iVar44,iVar38,ppcVar11);
            uVar2 = psVar10[lVar47 + lVar30];
            if ((short)(uVar2 | uVar1) < 0) {
              if (-1 < (short)uVar1) {
                piVar29 = pvVar9->dangle5[uVar27] + uVar24;
                goto LAB_0011f0cf;
              }
              if (-1 < (short)uVar2) {
                paiVar42 = local_38 + uVar27;
                goto LAB_0011f0a9;
              }
              iVar38 = 0;
            }
            else {
              paiVar42 = pvVar9->mismatchExt[uVar27] + uVar24;
LAB_0011f0a9:
              piVar29 = *paiVar42 + (uint)(int)(short)uVar2;
LAB_0011f0cf:
              iVar38 = *piVar29;
            }
            if (2 < uVar27) {
              iVar38 = iVar38 + pvVar9->TerminalAU;
            }
            *(int *)((long)pvVar31 + lVar30 * 4 + lVar52) = iVar38 + *(int *)(lVar46 + lVar30 * 4);
          }
        }
        lVar39 = lVar47 + lVar30;
        lVar30 = lVar30 + 1;
      } while (lVar39 < iVar37);
    }
    if ((code *)puVar18 != (code *)0x0 && iVar26 <= iVar37) {
      uVar51 = (long)iVar26 - 1;
      do {
        if (*(int *)((long)pvVar31 + uVar51 * 4 + lVar54 * -4 + 4) != 10000000) {
          iVar23 = (*(code *)puVar18)(i,uVar51 & 0xffffffff,(int)uVar51 + 2,&local_f0);
          piVar29 = (int *)((long)pvVar31 + uVar51 * 4 + lVar54 * -4 + 4);
          *piVar29 = *piVar29 + iVar23;
        }
        uVar51 = uVar51 + 1;
      } while ((long)uVar51 < (long)iVar37);
    }
    if ((((int)uVar25 <= iVar36 + i) && (*(int *)(lVar43 + -4 + lVar53 * 4) != 10000000)) &&
       (uVar19 = (*evaluate)(i,uVar25,iVar44,iVar48,'\x0e',&local_78), uVar19 != '\0')) {
      uVar25 = vrna_get_ptype_window(iVar44,iVar48,ppcVar11);
      uVar2 = local_40[lVar53];
      if ((short)(uVar2 | uVar1) < 0) {
        if (-1 < (short)uVar1) {
          piVar29 = pvVar9->dangle5[uVar25] + uVar24;
          goto LAB_0011f362;
        }
        if (-1 < (short)uVar2) {
          piVar29 = pvVar9->dangle3[uVar25] + (uint)(int)(short)uVar2;
          goto LAB_0011f362;
        }
        iVar36 = 0;
      }
      else {
        piVar29 = pvVar9->mismatchExt[uVar25][uVar24] + (uint)(int)(short)uVar2;
LAB_0011f362:
        iVar36 = *piVar29;
      }
      if (2 < uVar25) {
        iVar36 = iVar36 + pvVar9->TerminalAU;
      }
      *(int *)((long)pvVar31 + lVar53 * 4 + lVar54 * -4) =
           iVar36 + *(int *)(lVar43 + -4 + lVar53 * 4);
      if ((code *)puVar17 != (code *)0x0) {
        iVar36 = (*(code *)puVar17)(i,uVar28,iVar48,&local_f0);
        piVar29 = (int *)((long)pvVar31 + lVar53 * 4 + lVar54 * -4);
        *piVar29 = *piVar29 + iVar36;
      }
    }
  }
  iVar36 = (fc->params->model_details).min_loop_size;
  iVar21 = vrna_fun_zip_add_min
                     ((int *)((long)pvVar31 + (long)iVar36 * 4 + 4),
                      (fc->matrices->field_2).field_0.f5 + lVar54 + (long)iVar36 + 2,
                      (iVar21 - iVar36) - i);
  if (((int)uVar4 <= iVar20) &&
     (iVar20 = *(int *)((long)pvVar31 + lVar45 * 4 + lVar54 * -4), iVar20 <= iVar21)) {
    iVar21 = iVar20;
  }
  if ((int)local_88 < iVar22) {
    iVar22 = (int)local_88;
  }
  if (iVar50 <= iVar22) {
    iVar22 = iVar50;
  }
  free(pvVar31);
  if (iVar21 <= iVar22) {
    iVar22 = iVar21;
  }
  if (local_114 <= iVar22) {
    iVar22 = local_114;
  }
  if (9999999 < iVar22) {
    iVar22 = 10000000;
  }
LAB_0011f268:
  if (local_7c != 0) {
    uVar4 = fc->length;
    iVar44 = iVar44 + (fc->params->model_details).min_loop_size;
    lVar45 = *(long *)((fc->matrices->field_2).field_0.fc + lVar54 * 2);
    lVar43 = fc->window_size + lVar54;
    iVar20 = 10000000;
    iVar21 = (int)lVar43;
    if ((iVar44 < (int)uVar4) && (iVar44 <= iVar21)) {
      lVar30 = (long)iVar44;
      do {
        iVar44 = (fc->matrices->field_2).field_0.f5[lVar30 + 1];
        if (((iVar44 != 10000000) &&
            (iVar50 = *(int *)(lVar45 + lVar54 * -4 + lVar30 * 4), iVar50 != 10000000)) &&
           (iVar50 = iVar50 + iVar44, iVar50 <= iVar20)) {
          iVar20 = iVar50;
        }
      } while ((lVar30 + 1 < (long)(int)uVar4) &&
              (bVar55 = lVar30 < lVar43, lVar30 = lVar30 + 1, bVar55));
    }
    if (((int)uVar4 <= iVar21) &&
       (iVar44 = *(int *)(lVar45 + (long)(int)(uVar4 - i) * 4), iVar44 <= iVar20)) {
      iVar20 = iVar44;
    }
    if (iVar20 <= iVar22) {
      iVar22 = iVar20;
    }
  }
  free(local_f0.up_comparative);
  free(local_f0.user_cb_comparative);
  free(local_f0.user_data_comparative);
  return iVar22;
}

Assistant:

PUBLIC int
vrna_E_ext_loop_3(vrna_fold_compound_t  *fc,
                  int                   i)
{
  if (fc) {
    int                       e, en, dangle_model, with_gquad;
    vrna_param_t              *P;
    vrna_md_t                 *md;
    vrna_callback_hc_evaluate *evaluate;
    struct default_data       hc_dat_local;
    struct sc_wrapper_f3      sc_wrapper;

    e = INF;

    P             = fc->params;
    md            = &(P->model_details);
    dangle_model  = md->dangles;
    with_gquad    = md->gquad;
    evaluate      = prepare_hc_default_window(fc, &hc_dat_local);

    init_sc_wrapper_f3(fc, i, &sc_wrapper);

    /* first case: i stays unpaired */
    e = reduce_f3_up(fc, i, evaluate, &hc_dat_local, &sc_wrapper);

    /* decompose into stem followed by exterior loop part */
    switch (dangle_model) {
      case 0:
        en  = decompose_f3_ext_stem_d0(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;

      case 2:
        en  = decompose_f3_ext_stem_d2(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;

      default:
        en  = decompose_f3_ext_stem_d1(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;
    }

    if (with_gquad) {
      en  = add_f3_gquad(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
      e   = MIN2(e, en);
    }

    free_sc_wrapper_f3(&sc_wrapper);

    return e;
  }

  return INF;
}